

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::cose::CoseTest_CoseSignAndVerify_SignWithExternalData_Test::TestBody
          (CoseTest_CoseSignAndVerify_SignWithExternalData_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  pointer puVar3;
  char *pcVar4;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  ByteArray signature;
  Sign1Message msg;
  ByteArray externalData;
  mbedtls_pk_context publicKey;
  mbedtls_pk_context privateKey;
  ByteArray content;
  AssertHelper local_f8;
  undefined8 *local_f0;
  ByteArray local_e8;
  Error local_d0;
  ByteArray local_a8;
  Sign1Message local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  ErrorCode local_5c;
  mbedtls_pk_context_conflict local_58;
  mbedtls_pk_context_conflict local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_d0.mCode = 0x4030201;
  local_d0._4_2_ = 0x605;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l,(allocator_type *)&local_78);
  local_d0.mCode = 0x3040506;
  local_d0._4_2_ = 0x102;
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&local_d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_78,__l_00,(allocator_type *)&local_58);
  mbedtls_pk_init(&local_58);
  mbedtls_pk_init(&local_40);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
             "-----BEGIN CERTIFICATE-----\r\nMIICATCCAaegAwIBAgIIJU8KN/Bcw4cwCgYIKoZIzj0EAwIwGDEWMBQGA1UEAwwN\r\nVGhyZWFkR3JvdXBDQTAeFw0xOTA2MTkyMTM2MTFaFw0yNDA2MTcyMTM2MTFaMBox\r\nGDAWBgNVBAMMD1RocmVhZFJlZ2lzdHJhcjBZMBMGByqGSM49AgEGCCqGSM49AwEH\r\nA0IABCAwhVvoRpELPssVyvhXLT61Zb3GVKFe+vbt66qLnhYIxckQyTogho/IUE03\r\nDxsm+pdZ9nmDu3iGPtqay+pRJPajgdgwgdUwDwYDVR0TBAgwBgEB/wIBAjALBgNV\r\nHQ8EBAMCBeAwbAYDVR0RBGUwY6RhMF8xCzAJBgNVBAYTAlVTMRUwEwYDVQQKDAxU\r\naHJlYWQgR3JvdXAxFzAVBgNVBAMMDlRlc3QgUmVnaXN0cmFyMSAwHgYJKoZIhvcN\r\nAQkBFhFtYXJ0aW5Ac3Rva29lLm5ldDBHBgNVHSMEQDA+gBSS6nZAQEqPq08nC/O8\r\nN52GzXKA+KEcpBowGDEWMBQGA1UEAwwNVGhyZWFkR3JvdXBDQYIIc5C+m8ijatIw\r\nCgYIKoZIzj0EAwIDSAAwRQIgbI7Vrg348jGCENRtT3GbV5FaEqeBaVTeHlkCA99z\r\nRVACIQDGDdZSWXAR+AlfmrDecYnmp5Vgz8eTyjm9ZziIFXPUwA==\r\n-----END CERTIFICATE-----\r\n"
             ,"",(allocator_type *)&local_f8);
  ParsePublicKey(&local_d0,(mbedtls_pk_context *)&local_58,&local_a8);
  local_88.super_Object._vptr_Object._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,
             "ParsePublicKey(publicKey, ByteArray{kCertificate, kCertificate + sizeof(kCertificate)})"
             ,"ErrorCode::kNone",&local_d0,(ErrorCode *)&local_88);
  paVar1 = &local_d0.mMessage.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
             "-----BEGIN PRIVATE KEY-----\r\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgYJ/MP0dWA9BkYd4W\r\ns6oRY62hDddaEmrAVm5dtAXE/UGhRANCAAQgMIVb6EaRCz7LFcr4Vy0+tWW9xlSh\r\nXvr27euqi54WCMXJEMk6IIaPyFBNNw8bJvqXWfZ5g7t4hj7amsvqUST2\r\n-----END PRIVATE KEY-----\r\n"
             ,"",(allocator_type *)&local_f8);
  ParsePrivateKey(&local_d0,(mbedtls_pk_context *)&local_40,&local_a8);
  local_88.super_Object._vptr_Object._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,
             "ParsePrivateKey(privateKey, ByteArray{kPrivateKey, kPrivateKey + sizeof(kPrivateKey)})"
             ,"ErrorCode::kNone",&local_d0,(ErrorCode *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x7d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Sign1Message::Sign1Message(&local_88);
  Sign1Message::Init(&local_d0,&local_88,0);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,"msg.Init(kInitFlagsNone)","ErrorCode::kNone",&local_d0,
             (ErrorCode *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  Sign1Message::AddAttribute(&local_d0,&local_88,1,-7,1);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,
             "msg.AddAttribute(kHeaderAlgorithm, kAlgEcdsaWithSha256, kProtectOnly)",
             "ErrorCode::kNone",&local_d0,(ErrorCode *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  }
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Sign1Message::SetContent(&local_d0,&local_88,&local_e8);
  local_5c = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_f8,"msg.SetContent({})","ErrorCode::kNone",&local_d0,&local_5c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_f0 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = (char *)*local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x84,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (local_f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f0 != local_f0 + 2) {
      operator_delete((undefined8 *)*local_f0);
    }
    operator_delete(local_f0);
  }
  Sign1Message::SetExternalData(&local_d0,&local_88,&local_78);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,"msg.SetExternalData(externalData)","ErrorCode::kNone",&local_d0,
             (ErrorCode *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x85,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  Sign1Message::Sign(&local_d0,&local_88,&local_40);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,"msg.Sign(privateKey)","ErrorCode::kNone",&local_d0,
             (ErrorCode *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  Sign1Message::Serialize(&local_d0,&local_88,&local_a8);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,"msg.Serialize(signature)","ErrorCode::kNone",&local_d0,
             (ErrorCode *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  Sign1Message::Free(&local_88);
  Sign1Message::Deserialize(&local_d0,&local_88,&local_a8);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,"Sign1Message::Deserialize(msg, signature)","ErrorCode::kNone",
             &local_d0,(ErrorCode *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  Sign1Message::SetExternalData(&local_d0,&local_88,&local_78);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,"msg.SetExternalData(externalData)","ErrorCode::kNone",&local_d0,
             (ErrorCode *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  Sign1Message::Validate(&local_d0,&local_88,&local_58);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_e8,"msg.Validate(publicKey)","ErrorCode::kNone",&local_d0,
             (ErrorCode *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    plVar2 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0.mCode));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar3 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar3);
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoseTest, CoseSignAndVerify_SignWithExternalData)
{
    ByteArray content{1, 2, 3, 4, 5, 6};
    ByteArray externalData{6, 5, 4, 3, 2, 1};

    mbedtls_pk_context publicKey;
    mbedtls_pk_context privateKey;

    mbedtls_pk_init(&publicKey);
    mbedtls_pk_init(&privateKey);

    EXPECT_EQ(ParsePublicKey(publicKey, ByteArray{kCertificate, kCertificate + sizeof(kCertificate)}),
              ErrorCode::kNone);
    EXPECT_EQ(ParsePrivateKey(privateKey, ByteArray{kPrivateKey, kPrivateKey + sizeof(kPrivateKey)}), ErrorCode::kNone);

    ByteArray    signature;
    Sign1Message msg;

    EXPECT_EQ(msg.Init(kInitFlagsNone), ErrorCode::kNone);
    EXPECT_EQ(msg.AddAttribute(kHeaderAlgorithm, kAlgEcdsaWithSha256, kProtectOnly), ErrorCode::kNone);
    EXPECT_EQ(msg.SetContent({}), ErrorCode::kNone);
    EXPECT_EQ(msg.SetExternalData(externalData), ErrorCode::kNone);
    EXPECT_EQ(msg.Sign(privateKey), ErrorCode::kNone);

    EXPECT_EQ(msg.Serialize(signature), ErrorCode::kNone);
    msg.Free();

    EXPECT_EQ(Sign1Message::Deserialize(msg, signature), ErrorCode::kNone);
    EXPECT_EQ(msg.SetExternalData(externalData), ErrorCode::kNone);
    EXPECT_EQ(msg.Validate(publicKey), ErrorCode::kNone);
}